

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Sweep(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *pNew;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  Dch_Pars_t Pars;
  Dch_Pars_t local_70;
  
  Dch_ManSetDefaultParams(&local_70);
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"WCStvh"), iVar3 = globalUtilOptind, 0x56 < iVar1) {
      if (iVar1 == 0x76) {
        piVar4 = &local_70.fVerbose;
      }
      else {
        piVar4 = &local_70.fSimulateTfo;
        if (iVar1 != 0x74) {
          if (iVar1 == 0x57) {
            if (argc <= globalUtilOptind) {
              pcVar5 = "Command line switch \"-W\" should be followed by an integer.\n";
              goto LAB_0022fe6a;
            }
            uVar2 = atoi(argv[globalUtilOptind]);
            local_70.nWords = uVar2;
            goto LAB_0022fdbf;
          }
          goto LAB_0022fe76;
        }
      }
      *(byte *)piVar4 = (byte)*piVar4 ^ 1;
    }
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0022fe6a:
        Abc_Print(-1,pcVar5);
        break;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_70.nBTLimit = uVar2;
    }
    else {
      if (iVar1 != 0x53) {
        if (iVar1 == -1) {
          if (pAbc->pGia != (Gia_Man_t *)0x0) {
            iVar3 = Gia_ManBoxNum(pAbc->pGia);
            if ((iVar3 == 0) || (pAbc->pGia->pAigExtra != (Gia_Man_t *)0x0)) {
              iVar3 = Gia_ManBoxNum(pAbc->pGia);
              if (iVar3 == 0) {
                pNew = Gia_ManFraigSweepSimple(pAbc->pGia,&local_70);
              }
              else {
                pNew = Gia_ManSweepWithBoxes
                                 (pAbc->pGia,&local_70,(void *)0x0,0,0,local_70.fVerbose,0);
              }
              Abc_FrameUpdateGia(pAbc,pNew);
            }
            else {
              puts("Timing manager is given but there is no GIA of boxes.");
            }
            return 0;
          }
          pcVar5 = "Abc_CommandAbc9Sweep(): There is no AIG.\n";
          iVar3 = -1;
          goto LAB_0022ff39;
        }
        break;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_0022fe6a;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_70.nSatVarMax = uVar2;
    }
LAB_0022fdbf:
    globalUtilOptind = iVar3 + 1;
  } while (-1 < (int)uVar2);
LAB_0022fe76:
  Abc_Print(-2,"usage: &sweep [-WCS num] [-tvh]\n");
  Abc_Print(-2,"\t         performs SAT sweeping for AIG with boxes\n");
  Abc_Print(-2,"\t-W num : the max number of simulation words [default = %d]\n",
            (ulong)(uint)local_70.nWords);
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
            (ulong)(uint)local_70.nBTLimit);
  Abc_Print(-2,"\t-S num : the max number of SAT variables [default = %d]\n",
            (ulong)(uint)local_70.nSatVarMax);
  pcVar6 = "yes";
  pcVar5 = "yes";
  if (local_70.fSimulateTfo == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-t     : toggle simulation of the TFO classes [default = %s]\n",pcVar5);
  if (local_70.fVerbose == 0) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar6);
  pcVar5 = "\t-h     : print the command usage\n";
  iVar3 = -2;
LAB_0022ff39:
  Abc_Print(iVar3,pcVar5);
  return 1;
}

Assistant:

int Abc_CommandAbc9Sweep( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    Dch_Pars_t Pars, * pPars = &Pars;
    int c;
    Dch_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCStvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 't':
            pPars->fSimulateTfo ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sweep(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBoxNum(pAbc->pGia) && pAbc->pGia->pAigExtra == NULL )
    {
        printf( "Timing manager is given but there is no GIA of boxes.\n" );
        return 0;
    }
    if ( Gia_ManBoxNum(pAbc->pGia) )
        pTemp = Gia_ManSweepWithBoxes( pAbc->pGia, pPars, NULL, 0, 0, pPars->fVerbose, 0 );
    else
        pTemp = Gia_ManFraigSweepSimple( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &sweep [-WCS num] [-tvh]\n" );
    Abc_Print( -2, "\t         performs SAT sweeping for AIG with boxes\n" );
    Abc_Print( -2, "\t-W num : the max number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the max number of SAT variables [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-t     : toggle simulation of the TFO classes [default = %s]\n", pPars->fSimulateTfo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}